

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_type_createAnonymousPrimitiveValueTypeAndValueMetatype
          (sysbvm_context_t *context,sysbvm_tuple_t supertype)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_metatype_t *metatypeObject;
  sysbvm_tuple_t primitiveValueType;
  sysbvm_tuple_t metatype;
  sysbvm_tuple_t supertypeMetatype;
  sysbvm_tuple_t actualSuperType;
  sysbvm_tuple_t metatypeSupertype;
  sysbvm_tuple_t supertype_local;
  sysbvm_context_t *context_local;
  
  sVar2 = (context->roots).primitiveValueType;
  actualSuperType = sysbvm_tuple_getType(context,supertype);
  _Var1 = sysbvm_type_isDirectSubtypeOf(actualSuperType,(context->roots).primitiveValueType);
  if (!_Var1) {
    actualSuperType = sVar2;
  }
  sVar2 = sysbvm_type_createAnonymousValueMetatype(context,actualSuperType,0x1d);
  sVar3 = sysbvm_type_createAnonymousPrimitiveValueType(context,supertype,sVar2);
  sysbvm_type_setFlags(context,sVar2,0x11);
  *(sysbvm_tuple_t *)(sVar2 + 0xf8) = sVar3;
  return sVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createAnonymousPrimitiveValueTypeAndValueMetatype(sysbvm_context_t *context, sysbvm_tuple_t supertype)
{
    sysbvm_tuple_t metatypeSupertype = context->roots.primitiveValueType;
    sysbvm_tuple_t actualSuperType = supertype;
    sysbvm_tuple_t supertypeMetatype = sysbvm_tuple_getType(context, supertype);
    if(sysbvm_type_isDirectSubtypeOf(supertypeMetatype, context->roots.primitiveValueType))
        metatypeSupertype = supertypeMetatype;

    sysbvm_tuple_t metatype = sysbvm_type_createAnonymousValueMetatype(context, metatypeSupertype, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_primitiveValueType_t));
    sysbvm_tuple_t primitiveValueType = sysbvm_type_createAnonymousPrimitiveValueType(context, actualSuperType, metatype);

    sysbvm_type_setFlags(context, metatype, SYSBVM_TYPE_FLAGS_PRIMITIVE_VALUE_TYPE_METATYPE_FLAGS);

    // Link together the type with its metatype.
    sysbvm_metatype_t *metatypeObject = (sysbvm_metatype_t*)metatype;
    metatypeObject->thisType = primitiveValueType;
    return primitiveValueType;
}